

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O3

ModelComponent * __thiscall
lsim::ModelCircuit::create_component
          (ModelCircuit *this,char *circuit_name,uint32_t input_pins,uint32_t output_pins)

{
  uint32_t id;
  uint __val;
  ModelComponent *__ptr;
  bool bVar1;
  ModelComponent *pMVar2;
  long *value;
  char cVar3;
  char cVar4;
  ModelComponent *this_00;
  default_delete<lsim::ModelComponent> *this_01;
  BoolProperty *this_02;
  long lVar5;
  StringProperty *this_03;
  uint uVar6;
  string __str;
  allocator local_a1;
  ModelComponent *local_a0;
  _Head_base<0UL,_lsim::Property_*,_false> local_98;
  _Head_base<0UL,_lsim::Property_*,_false> local_90;
  uint local_88;
  undefined1 local_80 [16];
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  id = this->m_component_id;
  this->m_component_id = id + 1;
  this_00 = (ModelComponent *)operator_new(200);
  ModelComponent::ModelComponent(this_00,this,id,circuit_name,input_pins,output_pins);
  local_90._M_head_impl._0_4_ = this_00->m_id;
  local_a0 = this_00;
  this_01 = (default_delete<lsim::ModelComponent> *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->m_components,(key_type *)&local_90);
  pMVar2 = local_a0;
  local_a0 = (ModelComponent *)0x0;
  __ptr = *(ModelComponent **)this_01;
  *(ModelComponent **)this_01 = pMVar2;
  if (__ptr != (ModelComponent *)0x0) {
    std::default_delete<lsim::ModelComponent>::operator()(this_01,__ptr);
  }
  this_02 = (BoolProperty *)operator_new(0x30);
  BoolProperty::BoolProperty(this_02,"flip",false);
  local_90._M_head_impl = (Property *)this_02;
  ModelComponent::add_property(this_00,(uptr_t *)&local_90);
  if ((BoolProperty *)local_90._M_head_impl != (BoolProperty *)0x0) {
    (*((Property *)&(local_90._M_head_impl)->_vptr_Property)->_vptr_Property[1])();
  }
  std::__cxx11::string::string((string *)&local_50,circuit_name,&local_a1);
  __val = this_00->m_id;
  lVar5 = std::__cxx11::string::find((char)&local_50,0x2e);
  if (lVar5 == -1) {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>((string *)local_70,local_50,local_48 + (long)local_50)
    ;
  }
  else {
    std::__cxx11::string::substr((ulong)local_70,(ulong)&local_50);
  }
  std::__cxx11::string::append((char *)local_70);
  cVar4 = '\x01';
  if (9 < __val) {
    uVar6 = __val;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001682ad;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001682ad;
      }
      if (uVar6 < 10000) goto LAB_001682ad;
      bVar1 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_001682ad:
  local_90._M_head_impl = (Property *)local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_90._M_head_impl,local_88,__val);
  std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_head_impl);
  if (local_90._M_head_impl != (Property *)local_80) {
    operator_delete(local_90._M_head_impl,local_80._0_8_ + 1);
  }
  value = local_70[0];
  this_03 = (StringProperty *)operator_new(0x48);
  StringProperty::StringProperty(this_03,"caption",(char *)value);
  local_98._M_head_impl = (Property *)this_03;
  ModelComponent::add_property(this_00,(uptr_t *)&local_98);
  if ((StringProperty *)local_98._M_head_impl != (StringProperty *)0x0) {
    (*((Property *)&(local_98._M_head_impl)->_vptr_Property)->_vptr_Property[1])();
  }
  local_98._M_head_impl = (Property *)0x0;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_a0 != (ModelComponent *)0x0) {
    std::default_delete<lsim::ModelComponent>::operator()
              ((default_delete<lsim::ModelComponent> *)&local_a0,local_a0);
  }
  return this_00;
}

Assistant:

ModelComponent *ModelCircuit::create_component(const char *circuit_name, uint32_t input_pins, uint32_t output_pins) {
    auto component = std::make_unique<ModelComponent>(this, m_component_id++, circuit_name, input_pins, output_pins);
    auto result = component.get();
    m_components[result->id()] = std::move(component);
    result->add_property(make_property("flip", false));
    result->add_property(make_property("caption", unique_subcircuit_name(circuit_name, result->id()).c_str()));
    return result;
}